

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

sequence * toml::detail::syntax::local_datetime(sequence *__return_storage_ptr__,spec *s)

{
  initializer_list<unsigned_char> cs;
  character_either local_70;
  sequence local_50;
  sequence local_30;
  
  local_date(&local_30,s);
  local_50.super_scanner_base._vptr_scanner_base._0_2_ = 0x7454;
  local_50.super_scanner_base._vptr_scanner_base._2_1_ = 0x20;
  cs._M_len = 3;
  cs._M_array = (iterator)&local_50;
  character_either::character_either(&local_70,cs);
  local_time(&local_50,s);
  sequence::sequence<toml::detail::sequence,toml::detail::character_either,toml::detail::sequence>
            (__return_storage_ptr__,&local_30,&local_70,&local_50);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_50.others_);
  if (local_70.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_30.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence local_datetime(const spec& s)
{
    return sequence(local_date(s), time_delim(s), local_time(s));
}